

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O2

int SetChunk(char *fourcc,int chunk_num,WebPChunkIterator *iter)

{
  void *pvVar1;
  long lVar2;
  long *plVar3;
  int iVar4;
  ulong *puVar5;
  ulong *puVar6;
  int iVar7;
  ulong in_R10;
  
  iVar4 = 0;
  if (((-1 < chunk_num) && (fourcc != (char *)0x0)) &&
     (pvVar1 = iter->private_, pvVar1 != (void *)0x0)) {
    lVar2 = *(long *)((long)pvVar1 + 0x20);
    iVar7 = 0;
    puVar6 = (ulong *)((long)pvVar1 + 0x58);
    puVar5 = puVar6;
    while (plVar3 = (long *)*puVar5, plVar3 != (long *)0x0) {
      in_R10 = (ulong)*(uint *)(lVar2 + *plVar3);
      iVar7 = iVar7 + (uint)(*(uint *)(lVar2 + *plVar3) == *(uint *)fourcc);
      puVar5 = (ulong *)(plVar3 + 2);
    }
    iVar4 = 0;
    if (iVar7 != 0) {
      if (chunk_num == 0) {
        chunk_num = iVar7;
      }
      if (chunk_num <= iVar7) {
        iVar4 = 0;
        for (; puVar6 = (ulong *)*puVar6, puVar6 != (ulong *)0x0; puVar6 = puVar6 + 2) {
          in_R10 = *puVar6;
          iVar4 = iVar4 + (uint)(*(int *)(lVar2 + in_R10) == *(int *)fourcc);
          if (iVar4 == chunk_num) break;
        }
        (iter->chunk).bytes = (uint8_t *)(lVar2 + in_R10 + 8);
        (iter->chunk).size = puVar6[1] - 8;
        iter->num_chunks = iVar7;
        iter->chunk_num = chunk_num;
        iVar4 = 1;
      }
    }
  }
  return iVar4;
}

Assistant:

static int SetChunk(const char fourcc[4], int chunk_num,
                    WebPChunkIterator* const iter) {
  const WebPDemuxer* const dmux = (WebPDemuxer*)iter->private_;
  int count;

  if (dmux == NULL || fourcc == NULL || chunk_num < 0) return 0;
  count = ChunkCount(dmux, fourcc);
  if (count == 0) return 0;
  if (chunk_num == 0) chunk_num = count;

  if (chunk_num <= count) {
    const uint8_t* const mem_buf = dmux->mem.buf;
    const Chunk* const chunk = GetChunk(dmux, fourcc, chunk_num);
    iter->chunk.bytes = mem_buf + chunk->data.offset + CHUNK_HEADER_SIZE;
    iter->chunk.size  = chunk->data.size - CHUNK_HEADER_SIZE;
    iter->num_chunks  = count;
    iter->chunk_num   = chunk_num;
    return 1;
  }
  return 0;
}